

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isCubeMipmapLinearSampleResultValid
               (ConstPixelBufferAccess (*faces0) [6],ConstPixelBufferAccess (*faces1) [6],
               Sampler *sampler,FilterMode levelFilter,LookupPrecision *prec,
               CubeFaceFloatCoords *coords,Vec2 *fBounds,Vec4 *result)

{
  CubeFace CVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  TextureChannelClass TVar5;
  float fVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  CubeFaceIntCoords CVar24;
  CubeFaceIntCoords CVar25;
  CubeFaceIntCoords CVar26;
  CubeFaceIntCoords local_1f8;
  float fStack_1ec;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  float local_1b4;
  TextureChannelClass local_1b0;
  float local_1ac;
  ulong local_1a8;
  int local_1a0;
  int local_19c;
  float local_198;
  float local_194;
  float local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  ColorQuad quad1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 local_e8;
  Vec2 local_e0;
  Vec2 local_d8;
  Vec2 vBounds1;
  ColorQuad quad0;
  
  if (levelFilter == LINEAR) {
    CVar1 = coords->face;
    if (sampler->seamlessCubeMap == true) {
      iVar8 = (*faces0)[CVar1].m_size.m_data[0];
      iVar9 = (*faces1)[CVar1].m_size.m_data[0];
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,iVar8,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,iVar9,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_18c = iVar8;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,iVar8,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      local_180 = iVar9;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,iVar9,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar12 = floorf(uBounds0.m_data[0] + -0.5);
      local_1d0 = CONCAT44(local_1d0._4_4_,fVar12);
      fVar12 = floorf(uBounds0.m_data[1] + -0.5);
      local_1c0 = CONCAT44(local_1c0._4_4_,fVar12);
      local_1d8 = floorf(uBounds1.m_data[0] + -0.5);
      local_1dc = floorf(uBounds1.m_data[1] + -0.5);
      local_1e0 = floorf(vBounds0.m_data[0] + -0.5);
      local_1e4 = floorf(vBounds0.m_data[1] + -0.5);
      fVar12 = floorf(vBounds1.m_data[0] + -0.5);
      local_1c8 = CONCAT44(local_1c8._4_4_,fVar12);
      fVar12 = floorf(vBounds1.m_data[1] + -0.5);
      local_1a8 = CONCAT44(local_1a8._4_4_,fVar12);
      TVar5 = getTextureChannelClass((*faces0)[coords->face].m_format.type);
      if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_1d4 = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_1d4 = 0.0;
        if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_1d4 = computeBilinearSearchStepForUnorm(prec);
        }
      }
      fVar12 = (float)(int)(float)local_1d0;
      iVar8 = (int)(float)local_1c0;
      local_188 = (int)local_1d8;
      local_17c = (int)local_1dc;
      iVar9 = (int)local_1e4;
      local_190 = (float)(int)(float)local_1c8;
      local_184 = (int)(float)local_1a8;
      local_1b4 = (float)(int)local_1e0;
      local_1b0 = TVar5;
      local_1a0 = iVar9;
      local_19c = iVar8;
      local_198 = fVar12;
      while (fVar2 = local_1b4, bVar3 = (int)fVar2 <= iVar9, (int)fVar2 <= iVar9) {
        fVar13 = (float)(int)fVar2;
        local_1b4 = (float)((int)fVar2 + 1);
        fVar14 = fVar12;
        while ((int)fVar14 <= iVar8) {
          ColorQuad::ColorQuad(&quad0);
          iVar8 = local_18c;
          quad1.p00.m_data[1] = fVar14;
          quad1.p00.m_data[0] = (float)coords->face;
          quad1.p00.m_data[2] = fVar2;
          CVar24 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,local_18c);
          local_1e0 = (float)CVar24.t;
          fVar11 = (float)((int)fVar14 + 1);
          quad1.p00.m_data[1] = fVar11;
          quad1.p00.m_data[0] = (float)coords->face;
          quad1.p00.m_data[2] = fVar2;
          CVar25 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,iVar8);
          fVar12 = local_1b4;
          local_1dc = (float)CVar25.t;
          quad1.p00.m_data[1] = fVar14;
          quad1.p00.m_data[0] = (float)coords->face;
          quad1.p00.m_data[2] = local_1b4;
          local_1c0 = (ulong)(uint)fVar14;
          CVar26 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,iVar8);
          local_1d8 = (float)CVar26.t;
          local_1d0 = CVar26._0_8_;
          quad1.p00.m_data[1] = fVar11;
          quad1.p00.m_data[0] = (float)coords->face;
          quad1.p00.m_data[2] = fVar12;
          local_194 = fVar11;
          CVar26 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,iVar8);
          local_1e4 = (float)CVar26.t;
          uVar7 = CVar24._0_8_ & 0xffffffff;
          if (uVar7 == 6) {
            return bVar3;
          }
          uVar10 = local_1d0 & 0xffffffff;
          if ((float)local_1d0 == 8.40779e-45) {
            return bVar3;
          }
          if (CVar25.face == CUBEFACE_LAST) {
            return bVar3;
          }
          local_1c8 = CVar26._0_8_ & 0xffffffff;
          if (CVar26.face == CUBEFACE_LAST) {
            return bVar3;
          }
          lookup<float>((tcu *)&quad1,*faces0 + uVar7,sampler,CVar24.s,(int)local_1e0,0);
          quad0.p00.m_data[0] = quad1.p00.m_data[0];
          quad0.p00.m_data[1] = quad1.p00.m_data[1];
          quad0.p00.m_data[2] = quad1.p00.m_data[2];
          quad0.p00.m_data[3] = quad1.p00.m_data[3];
          lookup<float>((tcu *)&quad1,*faces0 + (CVar25._0_8_ & 0xffffffff),sampler,CVar25.s,
                        (int)local_1dc,0);
          quad0.p10.m_data[0] = quad1.p00.m_data[0];
          quad0.p10.m_data[1] = quad1.p00.m_data[1];
          quad0.p10.m_data[2] = quad1.p00.m_data[2];
          quad0.p10.m_data[3] = quad1.p00.m_data[3];
          lookup<float>((tcu *)&quad1,*faces0 + uVar10,sampler,(int)(local_1d0 >> 0x20),
                        (int)local_1d8,0);
          quad0.p01.m_data[0] = quad1.p00.m_data[0];
          quad0.p01.m_data[1] = quad1.p00.m_data[1];
          quad0.p01.m_data[2] = quad1.p00.m_data[2];
          quad0.p01.m_data[3] = quad1.p00.m_data[3];
          lookup<float>((tcu *)&quad1,*faces0 + local_1c8,sampler,CVar26.s,(int)local_1e4,0);
          quad0.p11.m_data[0] = quad1.p00.m_data[0];
          quad0.p11.m_data[1] = quad1.p00.m_data[1];
          quad0.p11.m_data[2] = quad1.p00.m_data[2];
          quad0.p11.m_data[3] = quad1.p00.m_data[3];
          fVar11 = local_1d4;
          if (local_1b0 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            fVar11 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
          }
          fVar12 = (float)(int)(float)local_1c0;
          fVar20 = (uBounds0.m_data[0] + -0.5) - fVar12;
          fVar22 = (uBounds0.m_data[1] + -0.5) - fVar12;
          auVar15._4_4_ = fVar22;
          auVar15._0_4_ = fVar20;
          auVar15._8_4_ = 0.0 - fVar12;
          auVar15._12_4_ = 0.0 - fVar12;
          auVar15 = minps(_DAT_009a4d00,auVar15);
          fVar21 = (vBounds0.m_data[0] + -0.5) - fVar13;
          fVar23 = (vBounds0.m_data[1] + -0.5) - fVar13;
          auVar16._4_4_ = fVar23;
          auVar16._0_4_ = fVar21;
          auVar16._8_4_ = 0.0 - fVar13;
          auVar16._12_4_ = 0.0 - fVar13;
          auVar16 = minps(_DAT_009a4d00,auVar16);
          fVar12 = local_190;
          while (fVar6 = fVar12, fVar12 = local_198, iVar8 = local_19c, iVar9 = local_1a0,
                fVar14 = local_194, (int)fVar6 <= local_184) {
            fVar14 = (float)(int)fVar6;
            local_1ac = (float)((int)fVar6 + 1);
            iVar8 = local_188;
            while (fVar12 = local_1ac, iVar8 <= local_17c) {
              ColorQuad::ColorQuad(&quad1);
              iVar9 = local_180;
              local_1f8.s = iVar8;
              local_1f8.face = coords->face;
              local_1f8.t = (int)fVar6;
              CVar24 = remapCubeEdgeCoords(&local_1f8,local_180);
              local_1e0 = (float)CVar24.t;
              fVar12 = (float)(iVar8 + 1);
              local_1f8.s = (int)fVar12;
              local_1f8.face = coords->face;
              local_1f8.t = (int)fVar6;
              CVar25 = remapCubeEdgeCoords(&local_1f8,iVar9);
              fVar17 = local_1ac;
              local_1dc = (float)CVar25.t;
              local_1f8.s = iVar8;
              local_1f8.face = coords->face;
              local_1f8.t = (int)local_1ac;
              CVar26 = remapCubeEdgeCoords(&local_1f8,iVar9);
              local_1d8 = (float)CVar26.t;
              local_1d0 = CVar26._0_8_;
              local_1f8.s = (int)fVar12;
              local_1f8.face = coords->face;
              local_1f8.t = (int)fVar17;
              local_1c0 = (ulong)(uint)fVar12;
              CVar26 = remapCubeEdgeCoords(&local_1f8,iVar9);
              local_1e4 = (float)CVar26.t;
              uVar7 = CVar24._0_8_ & 0xffffffff;
              if (uVar7 == 6) {
                return bVar3;
              }
              local_1a8 = local_1d0 & 0xffffffff;
              if ((float)local_1d0 == 8.40779e-45) {
                return bVar3;
              }
              if (CVar25.face == CUBEFACE_LAST) {
                return bVar3;
              }
              local_1c8 = CVar26._0_8_ & 0xffffffff;
              if (CVar26.face == CUBEFACE_LAST) {
                return bVar3;
              }
              lookup<float>((tcu *)&local_1f8,*faces1 + uVar7,sampler,CVar24.s,(int)local_1e0,0);
              quad1.p00.m_data[3] = fStack_1ec;
              quad1.p00.m_data[2] = (float)local_1f8.t;
              quad1.p00.m_data[0] = (float)local_1f8.face;
              quad1.p00.m_data[1] = (float)local_1f8.s;
              lookup<float>((tcu *)&local_1f8,*faces1 + (CVar25._0_8_ & 0xffffffff),sampler,CVar25.s
                            ,(int)local_1dc,0);
              quad1.p10.m_data[3] = fStack_1ec;
              quad1.p10.m_data[2] = (float)local_1f8.t;
              quad1.p10.m_data[0] = (float)local_1f8.face;
              quad1.p10.m_data[1] = (float)local_1f8.s;
              lookup<float>((tcu *)&local_1f8,*faces1 + local_1a8,sampler,(int)(local_1d0 >> 0x20),
                            (int)local_1d8,0);
              quad1.p01.m_data[3] = fStack_1ec;
              quad1.p01.m_data[2] = (float)local_1f8.t;
              quad1.p01.m_data[0] = (float)local_1f8.face;
              quad1.p01.m_data[1] = (float)local_1f8.s;
              lookup<float>((tcu *)&local_1f8,*faces1 + local_1c8,sampler,CVar26.s,(int)local_1e4,0)
              ;
              quad1.p11.m_data[3] = fStack_1ec;
              quad1.p11.m_data[2] = (float)local_1f8.t;
              quad1.p11.m_data[0] = (float)local_1f8.face;
              quad1.p11.m_data[1] = (float)local_1f8.s;
              fVar12 = local_1d4;
              if (local_1b0 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                fVar12 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
              }
              iVar8 = (int)local_1c0;
              fVar17 = (float)(iVar8 + -1);
              local_1f8.s = -(uint)(0.0 <= fVar22) & auVar15._4_4_;
              local_1f8.face = -(uint)(0.0 <= fVar20) & auVar15._0_4_;
              local_d8.m_data[1] = (float)(-(uint)(0.0 <= fVar23) & auVar16._4_4_);
              local_d8.m_data[0] = (float)(-(uint)(0.0 <= fVar21) & auVar16._0_4_);
              auVar19._0_4_ = (uBounds1.m_data[0] + -0.5) - fVar17;
              auVar19._4_4_ = (uBounds1.m_data[1] + -0.5) - fVar17;
              auVar19._8_4_ = 0.0 - fVar17;
              auVar19._12_4_ = 0.0 - fVar17;
              auVar18 = minps(_DAT_009a4d00,auVar19);
              local_e0.m_data[0] = (float)(-(uint)(0.0 <= auVar19._0_4_) & auVar18._0_4_);
              local_e0.m_data[1] = (float)(-(uint)(0.0 <= auVar19._4_4_) & auVar18._4_4_);
              auVar18._0_4_ = (vBounds1.m_data[0] + -0.5) - fVar14;
              auVar18._4_4_ = (vBounds1.m_data[1] + -0.5) - fVar14;
              auVar18._8_4_ = 0.0 - fVar14;
              auVar18._12_4_ = 0.0 - fVar14;
              auVar19 = minps(_DAT_009a4d00,auVar18);
              local_e8.m_data[0] = (float)(-(uint)(0.0 <= auVar18._0_4_) & auVar19._0_4_);
              local_e8.m_data[1] = (float)(-(uint)(0.0 <= auVar18._4_4_) & auVar19._4_4_);
              bVar4 = is2DTrilinearFilterResultValid
                                (prec,&quad0,&quad1,(Vec2 *)&local_1f8,&local_d8,&local_e0,&local_e8
                                 ,fBounds,(float)(~-(uint)(fVar11 <= fVar12) & (uint)fVar12 |
                                                 -(uint)(fVar11 <= fVar12) & (uint)fVar11),result);
              if (bVar4) {
                return bVar3;
              }
            }
          }
        }
      }
    }
    else {
      quad0.p00.m_data[0] = coords->s;
      quad0.p00.m_data[1] = coords->t;
      bVar3 = isLinearMipmapLinearSampleResultValid
                        (*faces0 + CVar1,*faces1 + CVar1,sampler,prec,(Vec2 *)&quad0,0,fBounds,
                         result);
    }
  }
  else {
    quad0.p00.m_data[0] = coords->s;
    quad0.p00.m_data[1] = coords->t;
    bVar3 = isNearestMipmapLinearSampleResultValid
                      (*faces0 + coords->face,*faces1 + coords->face,sampler,prec,(Vec2 *)&quad0,0,
                       fBounds,result);
  }
  return bVar3;
}

Assistant:

static bool isCubeMipmapLinearSampleResultValid (const ConstPixelBufferAccess	(&faces0)[CUBEFACE_LAST],
												 const ConstPixelBufferAccess	(&faces1)[CUBEFACE_LAST],
												 const Sampler&					sampler,
												 const Sampler::FilterMode		levelFilter,
												 const LookupPrecision&			prec,
												 const CubeFaceFloatCoords&		coords,
												 const Vec2&					fBounds,
												 const Vec4&					result)
{
	if (levelFilter == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamplessLinearMipmapLinearSampleResultValid(faces0, faces1, sampler, prec, coords, fBounds, result);
		else
			return isLinearMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
	}
	else
		return isNearestMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
}